

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O0

mraa_aio_context mraa_aio_init(uint aio)

{
  mraa_pin_t meta;
  mraa_boolean_t mVar1;
  mraa_result_t mVar2;
  mraa_aio_context dev_00;
  undefined8 in_stack_ffffffffffffff5c;
  mraa_result_t ret;
  mraa_result_t pre_ret;
  mraa_aio_context dev;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  uint local_24;
  mraa_board_t *pmStack_20;
  int pin;
  mraa_board_t *board;
  mraa_aio_context p_Stack_10;
  uint aio_local;
  
  pmStack_20 = plat;
  board._4_4_ = aio;
  if (plat == (mraa_board_t *)0x0) {
    syslog(3,"aio: Platform not initialised");
    p_Stack_10 = (mraa_aio_context)0x0;
  }
  else {
    mVar1 = mraa_is_sub_platform_id(aio);
    if (mVar1 != 0) {
      syslog(5,"aio: Using sub platform");
      pmStack_20 = pmStack_20->sub_platform;
      if (pmStack_20 == (mraa_board_t *)0x0) {
        syslog(3,"aio: Sub platform Not Initialised");
        return (mraa_aio_context)0x0;
      }
      board._4_4_ = mraa_get_sub_platform_index(board._4_4_);
    }
    if ((pmStack_20->aio_non_seq == 0) || ((uint)pmStack_20->aio_count <= board._4_4_)) {
      local_24 = board._4_4_ + pmStack_20->gpio_count;
    }
    else {
      local_24 = pmStack_20->aio_dev[board._4_4_].pin;
    }
    if (((int)local_24 < 0) || (pmStack_20->phy_pin_count <= (int)local_24)) {
      syslog(3,"aio: pin %i beyond platform definition",(ulong)local_24);
      p_Stack_10 = (mraa_aio_context)0x0;
    }
    else if (board._4_4_ < (uint)pmStack_20->aio_count) {
      if ((*(byte *)&pmStack_20->pins[(int)local_24].capabilities >> 6 & 1) == 1) {
        if (pmStack_20->pins[(int)local_24].aio.mux_total != 0) {
          memcpy(&dev,&pmStack_20->pins[(int)local_24].aio,100);
          meta.mux_total = (undefined4)local_78;
          meta.mux[0].pincmd = local_78._4_4_;
          meta.pinmap = (undefined4)uStack_80;
          meta.parent_id = uStack_80._4_4_;
          meta.mux[0].pin = (undefined4)uStack_70;
          meta.mux[0].value = uStack_70._4_4_;
          meta.mux[1].pincmd = (undefined4)local_68;
          meta.mux[1].pin = local_68._4_4_;
          meta.mux[1].value = (undefined4)uStack_60;
          meta.mux[2].pincmd = uStack_60._4_4_;
          meta.mux[2].pin = (undefined4)local_58;
          meta.mux[2].value = local_58._4_4_;
          meta.mux[3].pincmd = (undefined4)uStack_50;
          meta.mux[3].pin = uStack_50._4_4_;
          meta.mux[3].value = (undefined4)local_48;
          meta.mux[4].pincmd = local_48._4_4_;
          meta.mux[4].pin = (undefined4)uStack_40;
          meta.mux[4].value = uStack_40._4_4_;
          meta.mux[5].pincmd = (undefined4)local_38;
          meta.mux[5].pin = local_38._4_4_;
          meta.mux[5].value = (undefined4)uStack_30;
          meta.output_enable = uStack_30._4_4_;
          meta.complex_cap = (mraa_pin_cap_complex_t)local_28;
          meta.gpio_chip = (int)in_stack_ffffffffffffff5c;
          meta.gpio_line = (int)((ulong)in_stack_ffffffffffffff5c >> 0x20);
          mVar2 = mraa_setup_mux_mapped(meta);
          if (mVar2 != MRAA_SUCCESS) {
            syslog(3,"aio: unable to setup multiplexers for pin");
            return (mraa_aio_context)0x0;
          }
        }
        dev_00 = mraa_aio_init_internal
                           (pmStack_20->adv_func,board._4_4_,
                            pmStack_20->pins[(int)local_24].aio.pinmap);
        if (dev_00 == (mraa_aio_context)0x0) {
          syslog(3,"aio: Insufficient memory for specified input channel %d",(ulong)board._4_4_);
          p_Stack_10 = (mraa_aio_context)0x0;
        }
        else {
          raw_bits = mraa_adc_raw_bits();
          mraa_aio_set_bit(dev_00,10);
          if ((((dev_00 == (mraa_aio_context)0x0) ||
               (dev_00->advance_func == (mraa_adv_func_t *)0x0)) ||
              (dev_00->advance_func->aio_init_pre == (_func_mraa_result_t_uint *)0x0)) ||
             (mVar2 = (*dev_00->advance_func->aio_init_pre)(board._4_4_), mVar2 == MRAA_SUCCESS)) {
            p_Stack_10 = dev_00;
            if (((dev_00 != (mraa_aio_context)0x0) &&
                (dev_00->advance_func != (mraa_adv_func_t *)0x0)) &&
               ((dev_00->advance_func->aio_init_post != (_func_mraa_result_t_mraa_aio_context *)0x0
                && (mVar2 = (*dev_00->advance_func->aio_init_post)(dev_00), mVar2 != MRAA_SUCCESS)))
               ) {
              free(dev_00);
              p_Stack_10 = (mraa_aio_context)0x0;
            }
          }
          else {
            free(dev_00);
            p_Stack_10 = (mraa_aio_context)0x0;
          }
        }
      }
      else {
        syslog(3,"aio: pin %i not capable of aio",(ulong)local_24);
        p_Stack_10 = (mraa_aio_context)0x0;
      }
    }
    else {
      syslog(3,"aio: requested channel out of range");
      p_Stack_10 = (mraa_aio_context)0x0;
    }
  }
  return p_Stack_10;
}

Assistant:

mraa_aio_context
mraa_aio_init(unsigned int aio)
{
    mraa_board_t* board = plat;
    int pin;
    if (board == NULL) {
        syslog(LOG_ERR, "aio: Platform not initialised");
        return NULL;
    }
    if (mraa_is_sub_platform_id(aio)) {
        syslog(LOG_NOTICE, "aio: Using sub platform");
        board = board->sub_platform;
        if (board == NULL) {
            syslog(LOG_ERR, "aio: Sub platform Not Initialised");
            return NULL;
        }
        aio = mraa_get_sub_platform_index(aio);
    }

    // Some boards, like the BBB, don't have sequential AIO pins
    // They will have their own specific mapping to map aio -> pin
    if((board->aio_non_seq) && (aio < board->aio_count)){
        pin = board->aio_dev[aio].pin;
    } else {
        // aio are always past the gpio_count in the pin array
        pin = aio + board->gpio_count;
    }

    if (pin < 0 || pin >= board->phy_pin_count) {
        syslog(LOG_ERR, "aio: pin %i beyond platform definition", pin);
        return NULL;
    }
    if (aio >= board->aio_count) {
        syslog(LOG_ERR, "aio: requested channel out of range");
        return NULL;
    }
    if (board->pins[pin].capabilities.aio != 1) {
        syslog(LOG_ERR, "aio: pin %i not capable of aio", pin);
        return NULL;
    }
    if (board->pins[pin].aio.mux_total > 0) {
        if (mraa_setup_mux_mapped(board->pins[pin].aio) != MRAA_SUCCESS) {
            syslog(LOG_ERR, "aio: unable to setup multiplexers for pin");
            return NULL;
        }
    }

    // Create ADC device connected to specified channel
    mraa_aio_context dev = mraa_aio_init_internal(board->adv_func, aio, board->pins[pin].aio.pinmap);
    if (dev == NULL) {
        syslog(LOG_ERR, "aio: Insufficient memory for specified input channel %d", aio);
        return NULL;
    }

    raw_bits = mraa_adc_raw_bits();
    mraa_aio_set_bit(dev, DEFAULT_BITS);

    if (IS_FUNC_DEFINED(dev, aio_init_pre)) {
        mraa_result_t pre_ret = (dev->advance_func->aio_init_pre(aio));
        if (pre_ret != MRAA_SUCCESS) {
            free(dev);
            return NULL;
        }
    }

    if (IS_FUNC_DEFINED(dev, aio_init_post)) {
        mraa_result_t ret = dev->advance_func->aio_init_post(dev);
        if (ret != MRAA_SUCCESS) {
            free(dev);
            return NULL;
        }
    }

    return dev;
}